

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cc
# Opt level: O2

Int __thiscall ipx::Basis::AdaptToSingularFactorization(Basis *this)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  pointer piVar4;
  size_type __n;
  ulong uVar5;
  vector<int,_std::allocator<int>_> *__range1;
  pointer piVar6;
  long lVar7;
  long lVar8;
  vector<int,_std::allocator<int>_> dependent_cols;
  vector<int,_std::allocator<int>_> colperm;
  vector<int,_std::allocator<int>_> rowperm;
  _Vector_base<int,_std::allocator<int>_> local_68;
  _Vector_base<int,_std::allocator<int>_> local_48;
  _Vector_base<int,_std::allocator<int>_> local_30;
  
  __n = (size_type)this->model_->num_rows_;
  iVar1 = this->model_->num_cols_;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_30,__n,(allocator_type *)&local_48);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_48,__n,(allocator_type *)&local_68);
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_start = (int *)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (int *)0x0;
  LuUpdate::GetFactors
            ((this->lu_)._M_t.
             super___uniq_ptr_impl<ipx::LuUpdate,_std::default_delete<ipx::LuUpdate>_>._M_t.
             super__Tuple_impl<0UL,_ipx::LuUpdate_*,_std::default_delete<ipx::LuUpdate>_>.
             super__Head_base<0UL,_ipx::LuUpdate_*,_false>._M_head_impl,(SparseMatrix *)0x0,
             (SparseMatrix *)0x0,local_30._M_impl.super__Vector_impl_data._M_start,
             local_48._M_impl.super__Vector_impl_data._M_start,
             (vector<int,_std::allocator<int>_> *)&local_68);
  piVar3 = (this->basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar4 = (this->map2basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (piVar6 = local_68._M_impl.super__Vector_impl_data._M_start;
      piVar6 != local_68._M_impl.super__Vector_impl_data._M_finish; piVar6 = piVar6 + 1) {
    iVar2 = local_48._M_impl.super__Vector_impl_data._M_start[*piVar6];
    lVar7 = (long)piVar3[iVar2];
    lVar8 = (long)local_30._M_impl.super__Vector_impl_data._M_start[*piVar6] + (long)iVar1;
    piVar3[iVar2] = (int)lVar8;
    piVar4[lVar8] = iVar2;
    if (-1 < lVar7) {
      piVar4[lVar7] = -1;
    }
  }
  uVar5 = (long)local_68._M_impl.super__Vector_impl_data._M_finish -
          (long)local_68._M_impl.super__Vector_impl_data._M_start;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_68);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_30);
  return (Int)(uVar5 >> 2);
}

Assistant:

Int Basis::AdaptToSingularFactorization() {
    const Int m = model_.rows();
    const Int n = model_.cols();
    std::vector<Int> rowperm(m), colperm(m), dependent_cols;

    lu_->GetFactors(nullptr, nullptr, rowperm.data(), colperm.data(),
                    &dependent_cols);
    for (Int k : dependent_cols) {
        // Column p of the basis matrix was replaced by the i-th unit
        // column. Insert the corresponding slack variable jn into
        // position p of the basis.
        Int p = colperm[k];
        Int i = rowperm[k];
        Int jb = basis_[p];
        Int jn = n+i;
        assert(map2basis_[jn] < 0);
        basis_[p] = jn;
        map2basis_[jn] = p; // now BASIC at position p
        if (jb >= 0)
            map2basis_[jb] = -1; // now NONBASIC
    }
    return dependent_cols.size();
}